

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O0

void PredictorSub13_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  ushort uVar5;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  undefined1 auVar6 [16];
  __m128i res;
  __m128i pred;
  __m128i A4;
  __m128i A3;
  __m128i A2;
  __m128i bit_fix;
  __m128i A1;
  __m128i avg;
  __m128i sum;
  __m128i TL_lo;
  __m128i T_lo;
  __m128i L_lo;
  __m128i TL;
  __m128i T;
  __m128i src;
  __m128i L;
  __m128i zero;
  int i;
  int local_244;
  char local_1f8;
  char cStack_1f7;
  char cStack_1f6;
  char cStack_1f5;
  char cStack_1f4;
  char cStack_1f3;
  char cStack_1f2;
  char cStack_1f1;
  byte local_1c8;
  byte bStack_1c7;
  byte bStack_1c6;
  byte bStack_1c5;
  byte bStack_1c4;
  byte bStack_1c3;
  byte bStack_1c2;
  byte bStack_1c1;
  byte local_1a8;
  byte bStack_1a7;
  byte bStack_1a6;
  byte bStack_1a5;
  byte bStack_1a4;
  byte bStack_1a3;
  byte bStack_1a2;
  byte bStack_1a1;
  byte local_188;
  byte bStack_187;
  byte bStack_186;
  byte bStack_185;
  byte bStack_184;
  byte bStack_183;
  byte bStack_182;
  byte bStack_181;
  ushort uStack_156;
  ushort uStack_154;
  ushort uStack_152;
  ushort uStack_14e;
  ushort uStack_14c;
  ushort uStack_14a;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  ushort uStack_116;
  ushort uStack_114;
  ushort uStack_112;
  ushort uStack_10e;
  ushort uStack_10c;
  ushort uStack_10a;
  ushort uStack_106;
  ushort uStack_104;
  ushort uStack_102;
  ushort uStack_fe;
  ushort uStack_fc;
  ushort uStack_fa;
  ushort uStack_46;
  ushort uStack_44;
  ushort uStack_42;
  ushort uStack_3e;
  ushort uStack_3c;
  ushort uStack_3a;
  
  for (local_244 = 0; local_244 + 2 <= in_EDX; local_244 = local_244 + 2) {
    uVar1 = *(undefined8 *)(in_RDI + (long)(local_244 + -1) * 4);
    uVar2 = *(undefined8 *)(in_RDI + (long)local_244 * 4);
    uVar3 = *(undefined8 *)(in_RSI + (long)local_244 * 4);
    uVar4 = *(undefined8 *)(in_RSI + (long)(local_244 + -1) * 4);
    local_188 = (byte)uVar1;
    bStack_187 = (byte)((ulong)uVar1 >> 8);
    bStack_186 = (byte)((ulong)uVar1 >> 0x10);
    bStack_185 = (byte)((ulong)uVar1 >> 0x18);
    bStack_184 = (byte)((ulong)uVar1 >> 0x20);
    bStack_183 = (byte)((ulong)uVar1 >> 0x28);
    bStack_182 = (byte)((ulong)uVar1 >> 0x30);
    bStack_181 = (byte)((ulong)uVar1 >> 0x38);
    local_1a8 = (byte)uVar3;
    bStack_1a7 = (byte)((ulong)uVar3 >> 8);
    bStack_1a6 = (byte)((ulong)uVar3 >> 0x10);
    bStack_1a5 = (byte)((ulong)uVar3 >> 0x18);
    bStack_1a4 = (byte)((ulong)uVar3 >> 0x20);
    bStack_1a3 = (byte)((ulong)uVar3 >> 0x28);
    bStack_1a2 = (byte)((ulong)uVar3 >> 0x30);
    bStack_1a1 = (byte)((ulong)uVar3 >> 0x38);
    local_1c8 = (byte)uVar4;
    bStack_1c7 = (byte)((ulong)uVar4 >> 8);
    bStack_1c6 = (byte)((ulong)uVar4 >> 0x10);
    bStack_1c5 = (byte)((ulong)uVar4 >> 0x18);
    bStack_1c4 = (byte)((ulong)uVar4 >> 0x20);
    bStack_1c3 = (byte)((ulong)uVar4 >> 0x28);
    bStack_1c2 = (byte)((ulong)uVar4 >> 0x30);
    bStack_1c1 = (byte)((ulong)uVar4 >> 0x38);
    uStack_106 = (ushort)bStack_1a7;
    uStack_104 = (ushort)bStack_1a6;
    uStack_102 = (ushort)bStack_1a5;
    uStack_fe = (ushort)bStack_1a3;
    uStack_fc = (ushort)bStack_1a2;
    uStack_fa = (ushort)bStack_1a1;
    uStack_116 = (ushort)bStack_187;
    uStack_114 = (ushort)bStack_186;
    uStack_112 = (ushort)bStack_185;
    uStack_10e = (ushort)bStack_183;
    uStack_10c = (ushort)bStack_182;
    uStack_10a = (ushort)bStack_181;
    uVar5 = (ushort)((ushort)local_1a8 + (ushort)local_188) >> 1;
    uVar7 = (ushort)(uStack_106 + uStack_116) >> 1;
    uVar8 = (ushort)(uStack_104 + uStack_114) >> 1;
    uVar9 = (ushort)(uStack_102 + uStack_112) >> 1;
    uVar10 = (ushort)((ushort)bStack_1a4 + (ushort)bStack_184) >> 1;
    uVar11 = (ushort)(uStack_fe + uStack_10e) >> 1;
    uVar12 = (ushort)(uStack_fc + uStack_10c) >> 1;
    uVar13 = (ushort)(uStack_fa + uStack_10a) >> 1;
    uStack_156 = (ushort)bStack_1c7;
    uStack_154 = (ushort)bStack_1c6;
    uStack_152 = (ushort)bStack_1c5;
    uStack_14e = (ushort)bStack_1c3;
    uStack_14c = (ushort)bStack_1c2;
    uStack_14a = (ushort)bStack_1c1;
    uStack_46 = (ushort)bStack_1c7;
    uStack_44 = (ushort)bStack_1c6;
    uStack_42 = (ushort)bStack_1c5;
    uStack_3e = (ushort)bStack_1c3;
    uStack_3c = (ushort)bStack_1c2;
    uStack_3a = (ushort)bStack_1c1;
    auVar6._2_2_ = (uVar7 - uStack_156) + (ushort)(uVar7 < uStack_46);
    auVar6._0_2_ = (uVar5 - local_1c8) + (ushort)(uVar5 < local_1c8);
    auVar6._4_2_ = (uVar8 - uStack_154) + (ushort)(uVar8 < uStack_44);
    auVar6._6_2_ = (uVar9 - uStack_152) + (ushort)(uVar9 < uStack_42);
    auVar6._10_2_ = (uVar11 - uStack_14e) + (ushort)(uVar11 < uStack_3e);
    auVar6._8_2_ = (uVar10 - bStack_1c4) + (ushort)(uVar10 < bStack_1c4);
    auVar6._12_2_ = (uVar12 - uStack_14c) + (ushort)(uVar12 < uStack_3c);
    auVar6._14_2_ = (uVar13 - uStack_14a) + (ushort)(uVar13 < uStack_3a);
    auVar6 = psraw(auVar6,ZEXT416(1));
    local_138 = auVar6._0_2_;
    sStack_136 = auVar6._2_2_;
    sStack_134 = auVar6._4_2_;
    sStack_132 = auVar6._6_2_;
    sStack_130 = auVar6._8_2_;
    sStack_12e = auVar6._10_2_;
    sStack_12c = auVar6._12_2_;
    sStack_12a = auVar6._14_2_;
    local_138 = uVar5 + local_138;
    sStack_136 = uVar7 + sStack_136;
    sStack_134 = uVar8 + sStack_134;
    sStack_132 = uVar9 + sStack_132;
    sStack_130 = uVar10 + sStack_130;
    sStack_12e = uVar11 + sStack_12e;
    sStack_12c = uVar12 + sStack_12c;
    sStack_12a = uVar13 + sStack_12a;
    local_1f8 = (char)uVar2;
    cStack_1f7 = (char)((ulong)uVar2 >> 8);
    cStack_1f6 = (char)((ulong)uVar2 >> 0x10);
    cStack_1f5 = (char)((ulong)uVar2 >> 0x18);
    cStack_1f4 = (char)((ulong)uVar2 >> 0x20);
    cStack_1f3 = (char)((ulong)uVar2 >> 0x28);
    cStack_1f2 = (char)((ulong)uVar2 >> 0x30);
    cStack_1f1 = (char)((ulong)uVar2 >> 0x38);
    *(ulong *)(in_RCX + (long)local_244 * 4) =
         CONCAT17(cStack_1f1 -
                  ((0 < sStack_12a) * (sStack_12a < 0x100) * (char)sStack_12a - (0xff < sStack_12a))
                  ,CONCAT16(cStack_1f2 -
                            ((0 < sStack_12c) * (sStack_12c < 0x100) * (char)sStack_12c -
                            (0xff < sStack_12c)),
                            CONCAT15(cStack_1f3 -
                                     ((0 < sStack_12e) * (sStack_12e < 0x100) * (char)sStack_12e -
                                     (0xff < sStack_12e)),
                                     CONCAT14(cStack_1f4 -
                                              ((0 < sStack_130) * (sStack_130 < 0x100) *
                                               (char)sStack_130 - (0xff < sStack_130)),
                                              CONCAT13(cStack_1f5 -
                                                       ((0 < sStack_132) * (sStack_132 < 0x100) *
                                                        (char)sStack_132 - (0xff < sStack_132)),
                                                       CONCAT12(cStack_1f6 -
                                                                ((0 < sStack_134) *
                                                                 (sStack_134 < 0x100) *
                                                                 (char)sStack_134 -
                                                                (0xff < sStack_134)),
                                                                CONCAT11(cStack_1f7 -
                                                                         ((0 < sStack_136) *
                                                                          (sStack_136 < 0x100) *
                                                                          (char)sStack_136 -
                                                                         (0xff < sStack_136)),
                                                                         local_1f8 -
                                                                         ((0 < local_138) *
                                                                          (local_138 < 0x100) *
                                                                          (char)local_138 -
                                                                         (0xff < local_138)))))))));
  }
  if (local_244 != in_EDX) {
    (*VP8LPredictorsSub_C[0xd])
              ((uint32_t *)(in_RDI + (long)local_244 * 4),(uint32_t *)(in_RSI + (long)local_244 * 4)
               ,in_EDX - local_244,(uint32_t *)(in_RCX + (long)local_244 * 4));
  }
  return;
}

Assistant:

static void PredictorSub13_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* out) {
  int i;
  const __m128i zero = _mm_setzero_si128();
  for (i = 0; i + 2 <= num_pixels; i += 2) {
    // we can only process two pixels at a time
    const __m128i L = _mm_loadl_epi64((const __m128i*)&in[i - 1]);
    const __m128i src = _mm_loadl_epi64((const __m128i*)&in[i]);
    const __m128i T = _mm_loadl_epi64((const __m128i*)&upper[i]);
    const __m128i TL = _mm_loadl_epi64((const __m128i*)&upper[i - 1]);
    const __m128i L_lo = _mm_unpacklo_epi8(L, zero);
    const __m128i T_lo = _mm_unpacklo_epi8(T, zero);
    const __m128i TL_lo = _mm_unpacklo_epi8(TL, zero);
    const __m128i sum = _mm_add_epi16(T_lo, L_lo);
    const __m128i avg = _mm_srli_epi16(sum, 1);
    const __m128i A1 = _mm_sub_epi16(avg, TL_lo);
    const __m128i bit_fix = _mm_cmpgt_epi16(TL_lo, avg);
    const __m128i A2 = _mm_sub_epi16(A1, bit_fix);
    const __m128i A3 = _mm_srai_epi16(A2, 1);
    const __m128i A4 = _mm_add_epi16(avg, A3);
    const __m128i pred = _mm_packus_epi16(A4, A4);
    const __m128i res = _mm_sub_epi8(src, pred);
    _mm_storel_epi64((__m128i*)&out[i], res);
  }
  if (i != num_pixels) {
    VP8LPredictorsSub_C[13](in + i, upper + i, num_pixels - i, out + i);
  }
}